

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

void __thiscall snestistics::LargeBitfield::read_file(LargeBitfield *this,BigFile *f)

{
  uint in_EAX;
  uint32_t *puVar1;
  size_t in_RCX;
  ulong uVar2;
  void *__buf;
  uint32_t new_size;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  BigFile::read<unsigned_int>(f,(uint *)((long)&uStack_28 + 4));
  uVar2 = (ulong)uStack_28._4_4_;
  puVar1 = this->_state;
  if (uStack_28._4_4_ == this->_num_elements) {
    __buf = (void *)(uVar2 << 2);
  }
  else {
    if (puVar1 != (uint32_t *)0x0) {
      operator_delete__(puVar1);
      uVar2 = uStack_28 >> 0x20;
    }
    __buf = (void *)(uVar2 << 2);
    puVar1 = (uint32_t *)operator_new__((ulong)__buf);
    this->_state = puVar1;
    this->_num_elements = (uint32_t)uVar2;
  }
  BigFile::read(f,(int)puVar1,__buf,in_RCX);
  return;
}

Assistant:

void LargeBitfield::read_file(BigFile &f) {
	uint32_t new_size = 0;
	f.read(new_size);

	if (new_size != _num_elements) {
		delete[] _state;
		_state = new uint32_t[new_size];
		_num_elements = new_size;
	}

	f.read(_state, sizeof(uint32_t)*new_size);
}